

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBook.c
# Opt level: O3

uint Io_NtkWriteNodes(FILE *pFile,Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pNode;
  char *pcVar1;
  ProgressBar *p;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  
  if (pNtk->ntkType == ABC_NTK_NETLIST) {
    uVar3 = pNtk->vPos->nSize + pNtk->vPis->nSize;
    uVar5 = pNtk->nObjCounts[7] + uVar3 + pNtk->nObjCounts[8];
    printf("NumNodes : %d\t",(ulong)uVar5);
    printf("NumTerminals : %d\n",(ulong)uVar3);
    fwrite("UCLA    nodes    1.0\n",0x15,1,(FILE *)pFile);
    fprintf((FILE *)pFile,"NumNodes : %d\n",(ulong)uVar5);
    fprintf((FILE *)pFile,"NumTerminals : %d\n",(ulong)uVar3);
    pVVar2 = pNtk->vPis;
    if (0 < pVVar2->nSize) {
      lVar4 = 0;
      do {
        pcVar1 = Abc_ObjName(*(Abc_Obj_t **)
                              (*(long *)(*(long *)(*pVVar2->pArray[lVar4] + 0x20) + 8) +
                              (long)**(int **)((long)pVVar2->pArray[lVar4] + 0x30) * 8));
        fprintf((FILE *)pFile,"i%s_input\t",pcVar1);
        fwrite("terminal ",9,1,(FILE *)pFile);
        fprintf((FILE *)pFile," %d %d\n",1,1);
        lVar4 = lVar4 + 1;
        pVVar2 = pNtk->vPis;
      } while (lVar4 < pVVar2->nSize);
    }
    pVVar2 = pNtk->vPos;
    if (0 < pVVar2->nSize) {
      lVar4 = 0;
      do {
        pcVar1 = Abc_ObjName(*(Abc_Obj_t **)
                              (*(long *)(*(long *)(*pVVar2->pArray[lVar4] + 0x20) + 8) +
                              (long)**(int **)((long)pVVar2->pArray[lVar4] + 0x20) * 8));
        fprintf((FILE *)pFile,"o%s_output\t",pcVar1);
        fwrite("terminal ",9,1,(FILE *)pFile);
        fprintf((FILE *)pFile," %d %d\n",1,1);
        lVar4 = lVar4 + 1;
        pVVar2 = pNtk->vPos;
      } while (lVar4 < pVVar2->nSize);
    }
    uVar3 = 0;
    if ((pNtk->nObjCounts[8] != 0) && (pVVar2 = pNtk->vBoxes, uVar3 = 0, 0 < pVVar2->nSize)) {
      lVar4 = 0;
      uVar3 = 0;
      do {
        if ((*(uint *)&((Abc_Obj_t *)pVVar2->pArray[lVar4])->field_0x14 & 0xf) == 8) {
          Io_NtkWriteLatchNode(pFile,(Abc_Obj_t *)pVVar2->pArray[lVar4],0);
          uVar3 = uVar3 + 6;
          pVVar2 = pNtk->vBoxes;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pVVar2->nSize);
    }
    p = Extra_ProgressBarStart(_stdout,pNtk->nObjCounts[7]);
    pVVar2 = pNtk->vObjs;
    if (0 < pVVar2->nSize) {
      lVar4 = 0;
      do {
        pNode = (Abc_Obj_t *)pVVar2->pArray[lVar4];
        if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
          if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= lVar4)) {
            Extra_ProgressBarUpdate_int(p,(int)lVar4,(char *)0x0);
          }
          uVar5 = Io_NtkWriteIntNode(pFile,pNode,0);
          uVar3 = uVar3 + uVar5;
          pVVar2 = pNtk->vObjs;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pVVar2->nSize);
    }
    Extra_ProgressBarStop(p);
    return uVar3;
  }
  __assert_fail("Abc_NtkIsNetlist(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteBook.c"
                ,0xbf,"unsigned int Io_NtkWriteNodes(FILE *, Abc_Ntk_t *)");
}

Assistant:

unsigned Io_NtkWriteNodes( FILE * pFile, Abc_Ntk_t * pNtk )
{
    ProgressBar * pProgress;
    Abc_Obj_t * pLatch, * pNode;
    unsigned numTerms, numNodes, coreCellArea=0;
    int i;

    assert( Abc_NtkIsNetlist(pNtk) );
    // write the forehead
    numTerms=Abc_NtkPiNum(pNtk)+Abc_NtkPoNum(pNtk);
    numNodes=numTerms+Abc_NtkNodeNum(pNtk)+Abc_NtkLatchNum(pNtk);
    printf("NumNodes : %d\t", numNodes );
    printf("NumTerminals : %d\n", numTerms );
    fprintf( pFile, "UCLA    nodes    1.0\n");
    fprintf( pFile, "NumNodes : %d\n", numNodes );
    fprintf( pFile, "NumTerminals : %d\n", numTerms );
    // write the PI/POs
    Io_NtkWritePiPoNodes( pFile, pNtk );
    // write the latches
    if ( !Abc_NtkIsComb(pNtk) )
    {
	    Abc_NtkForEachLatch( pNtk, pLatch, i )
	    {
	        Io_NtkWriteLatchNode( pFile, pLatch, NODES );
	        coreCellArea+=6*coreHeight;
	    }
    }
    // write each internal node
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkNodeNum(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        coreCellArea+=Io_NtkWriteIntNode( pFile, pNode, NODES );
    }
    Extra_ProgressBarStop( pProgress );
    return coreCellArea;
}